

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_constraint.cpp
# Opt level: O2

string * __thiscall
duckdb::CheckConstraint::ToString_abi_cxx11_(string *__return_storage_ptr__,CheckConstraint *this)

{
  pointer pPVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->expression);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_30,pPVar1);
  ::std::operator+(&local_50,"CHECK(",&local_30);
  ::std::operator+(__return_storage_ptr__,&local_50,")");
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string CheckConstraint::ToString() const {
	return "CHECK(" + expression->ToString() + ")";
}